

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

void __thiscall zmq::socket_t::socket_t(socket_t *this,context_t *context_,int type_)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined4 in_EDX;
  error_t *in_RSI;
  socket_base *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  context_t::handle((context_t *)in_RSI);
  pvVar1 = zmq_socket((void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                      (int)((ulong)in_RDI >> 0x20));
  detail::socket_base::socket_base(in_RDI,pvVar1);
  pvVar1 = context_t::handle((context_t *)in_RSI);
  in_RDI[1]._handle = pvVar1;
  if (in_RDI->_handle == (void *)0x0) {
    uVar2 = __cxa_allocate_exception(0x10);
    error_t::error_t(in_RSI);
    __cxa_throw(uVar2,&error_t::typeinfo,error_t::~error_t);
  }
  return;
}

Assistant:

socket_t(context_t &context_, int type_) :
        detail::socket_base(zmq_socket(context_.handle(), type_)),
        ctxptr(context_.handle())
    {
        if (_handle == ZMQ_NULLPTR)
            throw error_t();
    }